

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O3

void __thiscall NaDynAr<NaNNUnit>::item::~item(item *this)

{
  NaNNUnit *pNVar1;
  
  pNVar1 = this->pData;
  if (pNVar1 == (NaNNUnit *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
    pNVar1 = this->pData;
    if (pNVar1 == (NaNNUnit *)0x0) goto LAB_00109398;
  }
  (**(code **)(*(long *)pNVar1 + 0x10))();
LAB_00109398:
  this->pData = (NaNNUnit *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }